

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<bool> __thiscall tinyusdz::primvar::PrimVar::get_value<bool>(PrimVar *this)

{
  bool bVar1;
  PrimVar *in_RSI;
  optional<bool> local_1c [6];
  PrimVar *this_local;
  
  this_local = this;
  bVar1 = is_blocked(in_RSI);
  if (bVar1) {
    nonstd::optional_lite::optional<bool>::optional((optional<bool> *)this);
  }
  else {
    bVar1 = has_default(in_RSI);
    if (bVar1) {
      tinyusdz::value::Value::get_value<bool>((Value *)local_1c,SUB81(in_RSI,0));
      nonstd::optional_lite::optional<bool>::optional<bool,_0>((optional<bool> *)this,local_1c);
      nonstd::optional_lite::optional<bool>::~optional(local_1c);
    }
    else {
      nonstd::optional_lite::optional<bool>::optional((optional<bool> *)this);
    }
  }
  return SUB82(this,0);
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }